

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

double __thiscall HVectorBase<double>::norm2(HVectorBase<double> *this)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->count;
  if (this->count < 1) {
    uVar2 = uVar3;
  }
  dVar4 = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3]];
    dVar4 = dVar4 + dVar1 * dVar1;
  }
  return dVar4;
}

Assistant:

Real HVectorBase<Real>::norm2() const {
  /*
   * Compute the squared 2-norm of the vector
   */
  const HighsInt workCount = count;
  const HighsInt* workIndex = &index[0];
  const Real* workArray = &array[0];

  Real result = Real{0};
  for (HighsInt i = 0; i < workCount; i++) {
    Real value = workArray[workIndex[i]];
    result += value * value;
  }
  return result;
}